

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

idx_t __thiscall duckdb::LocalTableStorage::EstimatedSize(LocalTableStorage *this)

{
  idx_t iVar1;
  pointer pLVar2;
  pointer puVar3;
  RowGroupCollection *pRVar4;
  idx_t iVar5;
  vector<duckdb::LogicalType,_true> *pvVar6;
  idx_t iVar7;
  BoundIndex *this_00;
  long lVar8;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_01;
  long lVar9;
  LogicalType *type;
  pointer pLVar10;
  
  pRVar4 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  iVar5 = RowGroupCollection::GetTotalRows(pRVar4);
  iVar1 = this->deleted_rows;
  pRVar4 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  pvVar6 = RowGroupCollection::GetTypes(pRVar4);
  pLVar2 = (pvVar6->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = 0;
  for (pLVar10 = (pvVar6->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start; pLVar10 != pLVar2; pLVar10 = pLVar10 + 1)
  {
    iVar7 = GetTypeIdSize(pLVar10->physical_type_);
    lVar8 = lVar8 + iVar7;
  }
  ::std::mutex::lock(&(this->append_indexes).indexes_lock);
  puVar3 = (this->append_indexes).indexes.
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = 0;
  for (this_01 = (this->append_indexes).indexes.
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar3; this_01 = this_01 + 1
      ) {
    this_00 = (BoundIndex *)
              unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                        (this_01);
    iVar7 = BoundIndex::GetInMemorySize(this_00);
    lVar9 = lVar9 + iVar7;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->append_indexes);
  return lVar9 + lVar8 * (iVar5 - iVar1);
}

Assistant:

idx_t LocalTableStorage::EstimatedSize() {
	// count the appended rows
	idx_t appended_rows = row_groups->GetTotalRows() - deleted_rows;

	// get the (estimated) size of a row (no compressions, etc.)
	idx_t row_size = 0;
	auto &types = row_groups->GetTypes();
	for (auto &type : types) {
		row_size += GetTypeIdSize(type.InternalType());
	}

	// get the index size
	idx_t index_sizes = 0;
	append_indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		index_sizes += index.Cast<BoundIndex>().GetInMemorySize();
		return false;
	});

	// return the size of the appended rows and the index size
	return appended_rows * row_size + index_sizes;
}